

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockHierarchyTest.cpp
# Opt level: O2

void __thiscall
TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_TestShell::
~TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_TestShell
          (TEST_MockHierarchyTest_EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated_TestShell
           *this)

{
  ExecFunctionTestShell::~ExecFunctionTestShell((ExecFunctionTestShell *)this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockHierarchyTest, EnableDisableWorkHierarchicallyWhenSupportIsDynamicallyCreated)
{
    mock().disable();
    mock("first").expectOneCall("boo");
    LONGS_EQUAL(0, mock("first").expectedCallsLeft());

    mock().enable();
    mock("second").expectOneCall("boo");
    LONGS_EQUAL(1, mock("second").expectedCallsLeft());

    mock().clear();
}